

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawFogBoundaryLinePalCommand::Execute
          (DrawFogBoundaryLinePalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  int local_2c;
  int x;
  uint8_t *dest;
  uint8_t *colormap;
  DrawerThread *thread_local;
  DrawFogBoundaryLinePalCommand *this_local;
  
  bVar4 = DrawerThread::line_skipped_by_thread
                    (thread,*(int *)&(this->super_PalSpanCommand).field_0x64);
  if (!bVar4) {
    puVar2 = this->_colormap;
    iVar1 = *(int *)(ylookup + (long)*(int *)&(this->super_PalSpanCommand).field_0x64 * 4);
    puVar3 = this->_destorg;
    local_2c = this->x1;
    do {
      puVar3[(long)local_2c + (long)iVar1] = puVar2[puVar3[(long)local_2c + (long)iVar1]];
      local_2c = local_2c + 1;
    } while (local_2c <= this->x2);
  }
  return;
}

Assistant:

void DrawFogBoundaryLinePalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t *colormap = _colormap;
		uint8_t *dest = ylookup[y] + _destorg;
		int x = x1;
		do
		{
			dest[x] = colormap[dest[x]];
		} while (++x <= x2);
	}